

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O0

double __thiscall chrono::curiosity::Curiosity::GetRoverMass(Curiosity *this)

{
  undefined8 uVar1;
  element_type *peVar2;
  __shared_ptr_access<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  __shared_ptr_access<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_01;
  __shared_ptr_access<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_02;
  __shared_ptr_access<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var3;
  __shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_03;
  double dVar4;
  double dVar5;
  undefined1 local_b8 [24];
  undefined1 local_a0 [4];
  int i_1;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [24];
  undefined1 local_48 [4];
  int i;
  undefined1 local_28 [24];
  double tot_mass;
  Curiosity *this_local;
  
  tot_mass = (double)this;
  std::
  __shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&this->m_chassis);
  CuriosityPart::GetBody((CuriosityPart *)local_28);
  peVar2 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
  dVar4 = ChBody::GetMass((ChBody *)peVar2);
  std::
  __shared_ptr_access<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&this->m_diff_bar);
  CuriosityPart::GetBody((CuriosityPart *)local_48);
  peVar2 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_48);
  dVar5 = ChBody::GetMass((ChBody *)peVar2);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_48);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_28);
  local_28._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(dVar4 + dVar5);
  for (local_60._20_4_ = 0; uVar1 = local_28._16_8_, (int)local_60._20_4_ < 2;
      local_60._20_4_ = local_60._20_4_ + 1) {
    this_00 = (__shared_ptr_access<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::array<std::shared_ptr<chrono::curiosity::CuriosityRocker>,_2UL>::operator[]
                           (&this->m_rockers,(long)(int)local_60._20_4_);
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(this_00);
    CuriosityPart::GetBody((CuriosityPart *)local_60);
    peVar2 = std::
             __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_60);
    dVar4 = ChBody::GetMass((ChBody *)peVar2);
    local_28._16_8_ = (double)uVar1 + dVar4;
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_60)
    ;
    uVar1 = local_28._16_8_;
    this_01 = (__shared_ptr_access<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::array<std::shared_ptr<chrono::curiosity::CuriosityBogie>,_2UL>::operator[]
                           (&this->m_bogies,(long)(int)local_60._20_4_);
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(this_01);
    CuriosityPart::GetBody((CuriosityPart *)local_70);
    peVar2 = std::
             __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_70);
    dVar4 = ChBody::GetMass((ChBody *)peVar2);
    local_28._16_8_ = (double)uVar1 + dVar4;
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_70)
    ;
    uVar1 = local_28._16_8_;
    this_02 = (__shared_ptr_access<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::array<std::shared_ptr<chrono::curiosity::CuriosityDifferentialLink>,_3UL>::
                 operator[](&this->m_diff_links,(long)(int)local_60._20_4_);
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(this_02);
    CuriosityPart::GetBody((CuriosityPart *)local_80);
    peVar2 = std::
             __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_80);
    dVar4 = ChBody::GetMass((ChBody *)peVar2);
    local_28._16_8_ = (double)uVar1 + dVar4;
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_80)
    ;
    uVar1 = local_28._16_8_;
    p_Var3 = (__shared_ptr_access<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::array<std::shared_ptr<chrono::curiosity::CuriosityUpright>,_2UL>::operator[]
                          (&this->m_rocker_uprights,(long)(int)local_60._20_4_);
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(p_Var3);
    CuriosityPart::GetBody((CuriosityPart *)local_90);
    peVar2 = std::
             __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_90);
    dVar4 = ChBody::GetMass((ChBody *)peVar2);
    local_28._16_8_ = (double)uVar1 + dVar4;
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_90)
    ;
    uVar1 = local_28._16_8_;
    p_Var3 = (__shared_ptr_access<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::array<std::shared_ptr<chrono::curiosity::CuriosityUpright>,_2UL>::operator[]
                          (&this->m_bogie_uprights,(long)(int)local_60._20_4_);
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(p_Var3);
    CuriosityPart::GetBody((CuriosityPart *)local_a0);
    peVar2 = std::
             __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_a0);
    dVar4 = ChBody::GetMass((ChBody *)peVar2);
    local_28._16_8_ = (double)uVar1 + dVar4;
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_a0)
    ;
  }
  for (local_b8._20_4_ = 0; uVar1 = local_28._16_8_, (int)local_b8._20_4_ < 6;
      local_b8._20_4_ = local_b8._20_4_ + 1) {
    this_03 = (__shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::array<std::shared_ptr<chrono::curiosity::CuriosityWheel>,_6UL>::operator[]
                           (&this->m_wheels,(long)(int)local_b8._20_4_);
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(this_03);
    CuriosityPart::GetBody((CuriosityPart *)local_b8);
    peVar2 = std::
             __shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_b8);
    dVar4 = ChBody::GetMass((ChBody *)peVar2);
    local_28._16_8_ = (double)uVar1 + dVar4;
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_b8)
    ;
  }
  return (double)local_28._16_8_;
}

Assistant:

double Curiosity::GetRoverMass() const {
    double tot_mass = m_chassis->GetBody()->GetMass() + m_diff_bar->GetBody()->GetMass();
    for (int i = 0; i < 2; i++) {
        tot_mass = tot_mass + m_rockers[i]->GetBody()->GetMass();
        tot_mass = tot_mass + m_bogies[i]->GetBody()->GetMass();
        tot_mass = tot_mass + m_diff_links[i]->GetBody()->GetMass();
        tot_mass = tot_mass + m_rocker_uprights[i]->GetBody()->GetMass();
        tot_mass = tot_mass + m_bogie_uprights[i]->GetBody()->GetMass();
    }
    for (int i = 0; i < 6; i++) {
        tot_mass = tot_mass + m_wheels[i]->GetBody()->GetMass();
    }
    return tot_mass;
}